

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

ion_err_t dictionary_build_predicate(ion_predicate_t *predicate,ion_predicate_type_t type,...)

{
  ion_key_t local_f8;
  ion_key_t local_f0;
  ion_key_t upper_bound;
  ion_key_t lower_bound;
  ion_key_t key;
  va_list arg_list;
  ion_predicate_type_t type_local;
  ion_predicate_t *predicate_local;
  
  predicate->type = type;
  switch(type) {
  case '\0':
    (predicate->statement).equality.equality_value = local_f8;
    predicate->destroy = dictionary_destroy_predicate_equality;
    break;
  case '\x01':
    (predicate->statement).equality.equality_value = local_f8;
    (predicate->statement).range.upper_bound = local_f0;
    predicate->destroy = dictionary_destroy_predicate_range;
    break;
  case '\x02':
    predicate->destroy = dictionary_destroy_predicate_all_records;
    break;
  case '\x03':
    return '\x05';
  default:
    return '\x05';
  }
  return '\0';
}

Assistant:

ion_err_t
dictionary_build_predicate(
	ion_predicate_t			*predicate,
	ion_predicate_type_t	type,
	...
) {
	va_list arg_list;

	va_start(arg_list, type);

	predicate->type = type;

	switch (type) {
		case predicate_equality: {
			ion_key_t key = va_arg(arg_list, ion_key_t);

			predicate->statement.equality.equality_value	= key;
			predicate->destroy								= dictionary_destroy_predicate_equality;
			break;
		}

		case predicate_range: {
			ion_key_t	lower_bound = va_arg(arg_list, ion_key_t);
			ion_key_t	upper_bound = va_arg(arg_list, ion_key_t);

			predicate->statement.range.lower_bound	= lower_bound;
			predicate->statement.range.upper_bound	= upper_bound;
			predicate->destroy						= dictionary_destroy_predicate_range;
			break;
		}

		case predicate_all_records: {
			predicate->destroy = dictionary_destroy_predicate_all_records;
			break;
		}

		case predicate_predicate: {
			return err_invalid_predicate;
		}

		default: {
			return err_invalid_predicate;
			break;
		}
	}

	va_end(arg_list);
	return err_ok;
}